

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  uint uVar1;
  SessionHandle *pSVar2;
  curl_sockopt_callback p_Var3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  if2ip_result_t iVar9;
  int iVar10;
  size_t sVar11;
  uint *puVar12;
  int *piVar13;
  char *pcVar14;
  char *pcVar15;
  undefined4 uVar16;
  if2ip_result_t iVar17;
  SessionHandle *data;
  socklen_t __len;
  long lVar18;
  ushort uVar19;
  bool bVar20;
  bool bVar21;
  timeval tVar22;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  Curl_sockaddr_storage sa;
  long port;
  char ipaddress [46];
  int optval;
  Curl_sockaddr_ex addr;
  Curl_sockaddr_storage add;
  uint local_348;
  undefined4 local_344;
  uint local_340;
  uint local_33c;
  SessionHandle *local_338;
  Curl_dns_entry *local_330;
  int local_324;
  SessionHandle *local_320;
  uint *local_318;
  socklen_t local_30c;
  sockaddr local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  long local_280;
  char local_278 [48];
  uint local_248 [64];
  undefined1 local_148 [144];
  sockaddr local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pSVar2 = conn->data;
  *sockp = -1;
  CVar5 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_148,(curl_socket_t *)&local_348);
  data = (SessionHandle *)0x0;
  if (CVar5 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var4 = getaddressinfo((sockaddr *)(local_148 + 0x10),local_278,&local_280);
  if (!_Var4) {
    puVar12 = (uint *)__errno_location();
    uVar1 = *puVar12;
    pcVar15 = Curl_strerror(conn,uVar1);
    Curl_failf(pSVar2,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar15);
    Curl_closesocket(conn,local_348);
    return CURLE_OK;
  }
  Curl_infof(pSVar2,"  Trying %s...\n",local_278);
  if ((pSVar2->set).tcp_nodelay == true) {
    data = conn->data;
    local_248[0] = (uint)(data->set).tcp_nodelay;
    iVar6 = setsockopt(local_348,6,1,local_248,4);
    if (iVar6 < 0) {
      piVar13 = __errno_location();
      pcVar15 = Curl_strerror(conn,*piVar13);
      Curl_infof(data,"Could not set TCP_NODELAY: %s\n",pcVar15);
    }
    else {
      Curl_infof(data,"TCP_NODELAY set\n");
    }
  }
  uVar1 = local_348;
  uVar7 = (uint)(pSVar2->set).tcp_keepalive;
  if (uVar7 == 1) {
    local_248[0] = uVar7;
    iVar6 = setsockopt(local_348,1,9,local_248,4);
    if (iVar6 < 0) {
      pcVar15 = "Failed to set SO_KEEPALIVE on fd %d\n";
    }
    else {
      local_248[0] = curlx_sltosi((pSVar2->set).tcp_keepidle);
      iVar6 = setsockopt(uVar1,6,4,local_248,4);
      if (iVar6 < 0) {
        Curl_infof(pSVar2,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)uVar1);
      }
      local_248[0] = curlx_sltosi((pSVar2->set).tcp_keepintvl);
      iVar6 = setsockopt(uVar1,6,5,local_248,4);
      if (-1 < iVar6) goto LAB_005528a1;
      pcVar15 = "Failed to set TCP_KEEPINTVL on fd %d\n";
    }
    Curl_infof(pSVar2,pcVar15,(ulong)uVar1);
  }
LAB_005528a1:
  uVar1 = local_348;
  p_Var3 = (pSVar2->set).fsockopt;
  iVar9 = IF2IP_NOT_FOUND;
  if (p_Var3 == (curl_sockopt_callback)0x0) {
    uVar16 = 0;
    local_324 = 0;
  }
  else {
    local_324 = (*p_Var3)((pSVar2->set).sockopt_client,local_348,CURLSOCKTYPE_IPCXN);
    if (local_324 == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = (undefined4)CONCAT71((int7)((ulong)data >> 8),1);
      if (local_324 != 2) {
        Curl_closesocket(conn,uVar1);
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
  }
  local_33c = local_348;
  local_340 = local_148._0_4_;
  local_338 = conn->data;
  local_330 = (Curl_dns_entry *)0x0;
  uVar19 = (local_338->set).localport;
  iVar6 = (local_338->set).localportrange;
  pcVar15 = (local_338->set).str[5];
  local_320 = pSVar2;
  local_318 = (uint *)sockp;
  memset(local_248,0,0x100);
  if (uVar19 == 0 && pcVar15 == (char *)0x0) goto LAB_00552d0b;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_308.sa_family = 0;
  local_308.sa_data[0] = '\0';
  local_308.sa_data[1] = '\0';
  local_308.sa_data[2] = '\0';
  local_308.sa_data[3] = '\0';
  local_308.sa_data[4] = '\0';
  local_308.sa_data[5] = '\0';
  local_308.sa_data[6] = '\0';
  local_308.sa_data[7] = '\0';
  local_308.sa_data[8] = '\0';
  local_308.sa_data[9] = '\0';
  local_308.sa_data[10] = '\0';
  local_308.sa_data[0xb] = '\0';
  local_308.sa_data[0xc] = '\0';
  local_308.sa_data[0xd] = '\0';
  local_344 = uVar16;
  if ((pcVar15 == (char *)0x0) || (sVar11 = strlen(pcVar15), 0xfe < sVar11)) {
    __len = 0;
    if (local_340 == 2) {
      local_308.sa_data._0_2_ = uVar19 << 8 | uVar19 >> 8;
      local_308.sa_family = 2;
      __len = 0x10;
    }
LAB_00552ba2:
    iVar8 = bind(local_33c,&local_308,__len);
    if (iVar8 < 0) {
      do {
        if (iVar6 < 2) {
          puVar12 = (uint *)__errno_location();
          pSVar2 = local_338;
          uVar1 = *puVar12;
          (local_338->state).os_errno = uVar1;
          pcVar15 = Curl_strerror(conn,uVar1);
          Curl_failf(pSVar2,"bind failed with errno %d: %s",(ulong)uVar1,pcVar15);
          goto LAB_00552ce2;
        }
        Curl_infof(local_338,"Bind to local port %hu failed, trying next\n",(ulong)uVar19);
        uVar19 = uVar19 + 1;
        if (local_308.sa_family == 2) {
          local_308.sa_data._0_2_ = uVar19 * 0x100 | uVar19 >> 8;
          local_308.sa_family = 2;
        }
        iVar8 = bind(local_33c,&local_308,__len);
        iVar6 = iVar6 + -1;
      } while (iVar8 < 0);
    }
    local_30c = 0x80;
    local_b8.sa_family = 0;
    local_b8.sa_data[0] = '\0';
    local_b8.sa_data[1] = '\0';
    local_b8.sa_data[2] = '\0';
    local_b8.sa_data[3] = '\0';
    local_b8.sa_data[4] = '\0';
    local_b8.sa_data[5] = '\0';
    local_b8.sa_data[6] = '\0';
    local_b8.sa_data[7] = '\0';
    local_b8.sa_data[8] = '\0';
    local_b8.sa_data[9] = '\0';
    local_b8.sa_data[10] = '\0';
    local_b8.sa_data[0xb] = '\0';
    local_b8.sa_data[0xc] = '\0';
    local_b8.sa_data[0xd] = '\0';
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    iVar6 = getsockname(local_33c,&local_b8,&local_30c);
    uVar16 = local_344;
    if (-1 < iVar6) {
      iVar9 = IF2IP_NOT_FOUND;
      Curl_infof(local_338,"Local port: %hu\n",(ulong)uVar19);
      (conn->bits).bound = true;
      goto LAB_00552d0b;
    }
    puVar12 = (uint *)__errno_location();
    pSVar2 = local_338;
    uVar1 = *puVar12;
    (local_338->state).os_errno = uVar1;
    pcVar15 = Curl_strerror(conn,uVar1);
    Curl_failf(pSVar2,"getsockname() failed with errno %d: %s",(ulong)uVar1,pcVar15);
  }
  else {
    lVar18 = 3;
    iVar8 = strncmp("if!",pcVar15,3);
    bVar20 = iVar8 == 0;
    if (bVar20) {
      bVar21 = false;
    }
    else {
      iVar8 = strncmp("host!",pcVar15,5);
      bVar21 = iVar8 == 0;
      lVar18 = (ulong)bVar21 * 5;
    }
    iVar8 = 0;
    pcVar15 = pcVar15 + lVar18;
    if (!bVar21) {
      iVar9 = Curl_if2ip(local_340,conn->scope,pcVar15,(char *)local_248,0x100);
      if (iVar9 == IF2IP_FOUND) {
        Curl_infof(local_338,"Local Interface %s is ip %s using address family %i\n",pcVar15,
                   local_248,(ulong)local_340);
        sVar11 = strlen(pcVar15);
        iVar8 = setsockopt(local_33c,1,0x19,pcVar15,(int)sVar11 + 1);
        bVar20 = true;
        if (iVar8 != 0) {
          puVar12 = (uint *)__errno_location();
          uVar1 = *puVar12;
          pcVar14 = Curl_strerror(conn,uVar1);
          Curl_infof(local_338,"SO_BINDTODEVICE %s failed with errno %d: %s; will do regular bind\n"
                     ,pcVar15,(ulong)uVar1,pcVar14);
        }
        iVar8 = 1;
      }
      else {
        uVar16 = local_344;
        if (iVar9 == IF2IP_AF_NOT_SUPPORTED) goto LAB_00552d0b;
        if (iVar9 == IF2IP_NOT_FOUND) {
          iVar8 = 0;
          if (bVar20) {
            Curl_failf(local_338,"Couldn\'t bind to interface \'%s\'",pcVar15);
LAB_00552ce2:
            iVar9 = 0x2d;
            uVar16 = local_344;
            goto LAB_00552d0b;
          }
        }
        else {
          iVar8 = 0;
        }
      }
    }
    if (!bVar20) {
      lVar18 = conn->ip_version;
      if (local_340 == 2) {
        conn->ip_version = 1;
      }
      Curl_resolv(conn,pcVar15,0,&local_330);
      conn->ip_version = lVar18;
      if (local_330 == (Curl_dns_entry *)0x0) {
        iVar8 = -1;
      }
      else {
        Curl_printable_address(local_330->addr,(char *)local_248,0x100);
        pSVar2 = local_338;
        Curl_infof(local_338,"Name \'%s\' family %i resolved to \'%s\' family %i\n",pcVar15,
                   (ulong)local_340,local_248,(ulong)(uint)local_330->addr->ai_family);
        Curl_resolv_unlock(pSVar2,local_330);
        iVar8 = 1;
      }
    }
    __len = 0;
    if ((local_340 == 2 && 0 < iVar8) &&
       (iVar10 = inet_pton(2,(char *)local_248,local_308.sa_data + 2), __len = 0, 0 < iVar10)) {
      local_308.sa_data._0_2_ = uVar19 << 8 | uVar19 >> 8;
      local_308.sa_family = 2;
      __len = 0x10;
    }
    uVar16 = local_344;
    if (0 < iVar8) goto LAB_00552ba2;
    Curl_failf(local_338,"Couldn\'t bind to \'%s\'",pcVar15);
  }
  iVar9 = 0x2d;
LAB_00552d0b:
  pSVar2 = local_320;
  if (iVar9 == IF2IP_NOT_FOUND) {
    curlx_nonblock(local_33c,1);
    tVar22 = curlx_tvnow();
    conn->connecttime = tVar22;
    if (1 < conn->num_addr) {
      Curl_expire_latest(pSVar2,conn->timeoutms_per_addr);
    }
    puVar12 = local_318;
    if (((char)uVar16 == '\0') && (conn->socktype == 1)) {
      iVar8 = connect(local_348,(sockaddr *)(local_148 + 0x10),local_148._12_4_);
      iVar6 = local_324;
      if (iVar8 == -1) {
        piVar13 = __errno_location();
        iVar6 = *piVar13;
      }
      iVar17 = IF2IP_NOT_FOUND;
      bVar20 = true;
      if (((iVar8 == -1) && (iVar6 != 0xb)) && (iVar6 != 0x73)) {
        pcVar15 = Curl_strerror(conn,iVar6);
        pSVar2 = local_320;
        bVar20 = false;
        Curl_infof(local_320,"Immediate connect fail for %s: %s\n",local_278,pcVar15);
        (pSVar2->state).os_errno = iVar6;
        Curl_closesocket(conn,local_348);
        iVar17 = 7;
      }
      if (bVar20) {
        *puVar12 = local_348;
      }
    }
    else {
      *local_318 = local_348;
      iVar17 = IF2IP_NOT_FOUND;
    }
  }
  else {
    Curl_closesocket(conn,local_33c);
    iVar17 = IF2IP_NOT_FOUND;
    if (iVar9 != IF2IP_AF_NOT_SUPPORTED) {
      iVar17 = iVar9;
    }
  }
  return iVar17;
}

Assistant:

static CURLcode
singleipconnect(struct connectdata *conn,
                const Curl_addrinfo *ai,
                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc;
  int error = 0;
  bool isconnected = FALSE;
  struct SessionHandle *data = conn->data;
  curl_socket_t sockfd;
  CURLcode res = CURLE_OK;
  char ipaddress[MAX_IPADR_LEN];
  long port;

  *sockp = CURL_SOCKET_BAD;

  res = Curl_socket(conn, ai, &addr, &sockfd);
  if(res)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

  if(data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  res = bindlocal(conn, sockfd, addr.family);
  if(res) {
    Curl_closesocket(conn, sockfd); /* close socket and bail out */
    if(res == CURLE_UNSUPPORTED_PROTOCOL) {
      /* The address family is not supported on this interface.
         We can continue trying addresses */
      return CURLE_OK;
    }
    return res;
  }

  /* set socket non-blocking */
  curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire_latest(data, conn->timeoutms_per_addr);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      res = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn,error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      res = CURLE_COULDNT_CONNECT;
    }
  }

  if(!res)
    *sockp = sockfd;

  return res;
}